

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineGenDrawCommands::Run(AdvancedPipelineGenDrawCommands *this)

{
  CallLogWrapper *this_00;
  vec4 *pvVar1;
  float *pfVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float fVar4;
  RenderTarget *pRVar5;
  bool bVar6;
  int row;
  GLuint GVar7;
  GLint location;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  int row_1;
  bool *compile_error;
  bool *compile_error_00;
  GLsizeiptr offset;
  void *pvVar11;
  ulong uVar12;
  int i;
  int v0;
  string *vs;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  undefined4 uVar17;
  float fVar18;
  float fVar19;
  GLint res;
  Matrix<float,_4,_4> res_1;
  int local_1fc;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  ulong uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 *local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d6,&local_1fc);
  if (local_1fc < 1) {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,"GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0","");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    paVar3 = &local_1b8.field_2;
    local_1b8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,
               "\nlayout(local_size_x = 4) in;\nstruct DrawCommand {\n  uint count;\n  uint instance_count;\n  uint first_index;\n  int base_vertex;\n  uint base_instance;\n};\nlayout(std430) buffer;\nlayout(binding = 0) readonly buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nlayout(binding = 1) writeonly buffer DrawCommandBuffer {\n  DrawCommand g_command[4];\n};\nbool IsObjectVisible(uint id) {\n  if (g_objects.transform[id][3].x < -1.0 || g_objects.transform[id][3].x > 1.0) return false;\n  if (g_objects.transform[id][3][1] < -1.0 || g_objects.transform[id][3][1] > 1.0) return false;\n  if (g_objects.transform[id][3][2] < -1.0 || g_objects.transform[id][3].z > 1.0) return false;\n  return true;\n}\nvoid main() {\n  uint id = gl_GlobalInvocationID.x;\n  g_command[id].count = 0;\n  g_command[id].instance_count = 0;\n  g_command[id].first_index = 0;\n  g_command[id].base_vertex = 0;\n  g_command[id].base_instance = 0;\n  if (IsObjectVisible(id)) {\n    g_command[id].count = g_objects.count[id];\n    g_command[id].instance_count = 1;\n    g_command[id].first_index = g_objects.first_index[id];\n  }\n}"
               ,"");
    GVar7 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1b8);
    this->m_program[0] = GVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
    bVar6 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[0],compile_error);
    if (!bVar6) {
      return -1;
    }
    local_1b8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec3 g_color;\nout StageData {\n  vec3 color;\n} g_vs_out;\nlayout(binding = 0, std430) buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nuniform int g_object_id;\nvoid main() {\n  gl_Position = g_objects.transform[g_object_id] * g_position;\n  g_vs_out.color = g_color;\n}"
               ,"");
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,
               "\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(g_fs_in.color, 1);\n}"
               ,"");
    vs = &local_1b8;
    GVar7 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,vs,&local_1f8);
    this->m_program[1] = GVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
    bVar6 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[1],compile_error_00);
    if (!bVar6) {
      return -1;
    }
    lVar13 = 0;
    glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8.field_2._8_8_ = 0;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    lVar8 = 0;
    do {
      lVar10 = 0;
      do {
        uVar17 = 0x3f800000;
        if (lVar13 != lVar10) {
          uVar17 = 0;
        }
        *(undefined4 *)((long)&(vs->_M_dataplus)._M_p + lVar10) = uVar17;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      lVar8 = lVar8 + 1;
      vs = (string *)((long)&(vs->_M_dataplus)._M_p + 4);
      lVar13 = lVar13 + 0x10;
    } while (lVar8 != 4);
    puVar9 = &local_178;
    local_188 = 0xbf000000bfc00000;
    uStack_180 = uStack_180 & 0xffffffff00000000;
    local_178 = 0;
    uStack_170 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    uStack_150 = 0;
    uStack_140 = 0;
    lVar8 = 0;
    lVar13 = 0;
    do {
      lVar10 = 0;
      do {
        uVar17 = 0x3f800000;
        if (lVar8 != lVar10) {
          uVar17 = 0;
        }
        *(undefined4 *)((long)puVar9 + lVar10) = uVar17;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      lVar13 = lVar13 + 1;
      puVar9 = (undefined8 *)((long)puVar9 + 4);
      lVar8 = lVar8 + 0x10;
    } while (lVar13 != 4);
    puVar9 = &local_138;
    local_148 = 0xbf0000003f000000;
    uStack_140 = uStack_140 & 0xffffffff00000000;
    local_138 = 0;
    uStack_130 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    uStack_100 = 0;
    lVar8 = 0;
    lVar13 = 0;
    do {
      lVar10 = 0;
      do {
        uVar17 = 0x3f800000;
        if (lVar8 != lVar10) {
          uVar17 = 0;
        }
        *(undefined4 *)((long)puVar9 + lVar10) = uVar17;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      lVar13 = lVar13 + 1;
      puVar9 = (undefined8 *)((long)puVar9 + 4);
      lVar8 = lVar8 + 0x10;
    } while (lVar13 != 4);
    puVar9 = &local_f8;
    local_108 = 0x3f000000bf000000;
    uStack_100 = uStack_100 & 0xffffffff00000000;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    uStack_c0 = 0;
    lVar8 = 0;
    lVar13 = 0;
    do {
      lVar10 = 0;
      do {
        uVar17 = 0x3f800000;
        if (lVar8 != lVar10) {
          uVar17 = 0;
        }
        *(undefined4 *)((long)puVar9 + lVar10) = uVar17;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      lVar13 = lVar13 + 1;
      puVar9 = (undefined8 *)((long)puVar9 + 4);
      lVar8 = lVar8 + 0x10;
    } while (lVar13 != 4);
    local_c8 = &DAT_3f0000003f000000;
    uStack_c0 = uStack_c0 & 0xffffffff00000000;
    local_b8 = 0x400000004;
    uStack_b0 = 0x400000004;
    local_a8 = 0x400000000;
    uStack_a0 = 0xc00000008;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_object_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_object_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x120,&local_1b8,0x88e4);
    local_1b8._M_dataplus._M_p = (pointer)0xbecccccdbecccccd;
    local_1b8._M_string_length = 0x3f80000000000000;
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8.field_2._8_8_ = 0xbecccccd3ecccccd;
    local_198 = 0x3f80000000000000;
    uStack_190 = 0;
    local_188 = 0x3ecccccdbecccccd;
    uStack_180 = 0x3f80000000000000;
    local_178 = 0;
    uStack_170 = 0x3ecccccd3ecccccd;
    local_168 = 0x3f80000000000000;
    uStack_160 = 0;
    local_158 = 0xbecccccdbecccccd;
    uStack_150 = 0;
    local_148 = 0x3f800000;
    uStack_140 = 0xbecccccd3ecccccd;
    local_138 = 0;
    uStack_130 = 0x3f800000;
    local_128 = 0x3ecccccdbecccccd;
    uStack_120 = 0;
    local_118 = 0x3f800000;
    uStack_110 = 0x3ecccccd3ecccccd;
    local_108 = 0;
    uStack_100 = 0x3f800000;
    local_f8 = 0xbecccccdbecccccd;
    uStack_f0 = 0;
    local_e8 = 0x3f80000000000000;
    uStack_e0 = 0xbecccccd3ecccccd;
    local_d8 = 0;
    uStack_d0 = 0x3f80000000000000;
    local_c8 = (undefined1 *)0x3ecccccdbecccccd;
    uStack_c0 = 0;
    local_b8 = 0x3f80000000000000;
    uStack_b0 = 0x3ecccccd3ecccccd;
    local_a8 = 0;
    uStack_a0 = 0x3f80000000000000;
    local_98 = 0xbecccccdbecccccd;
    uStack_90 = 0x3f80000000000000;
    local_88 = 0x3f800000;
    uStack_80 = 0xbecccccd3ecccccd;
    local_78 = 0x3f80000000000000;
    uStack_70 = 0x3f800000;
    local_68 = 0x3ecccccdbecccccd;
    uStack_60 = 0x3f80000000000000;
    local_58 = 0x3f800000;
    uStack_50 = 0x3ecccccd3ecccccd;
    local_48 = 0x3f80000000000000;
    uStack_40 = 0x3f800000;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x180,&local_1b8,0x88e4);
    v0 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    local_1b8.field_2._M_allocated_capacity = 0xb000a00090008;
    local_1b8.field_2._8_8_ = 0xf000e000d000c;
    local_1b8._M_dataplus._M_p = (pointer)0x3000200010000;
    local_1b8._M_string_length = 0x7000600050004;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_index_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_index_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8893,0x20,&local_1b8,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_draw_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->m_draw_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x50,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,0);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,3,0x1406,'\0',0x18,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,3,0x1406,'\0',0x18,(void *)0xc);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_index_buffer);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_draw_buffer);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->m_draw_buffer);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x40);
    pvVar11 = (void *)0x0;
    do {
      location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[1],"g_object_id")
      ;
      glu::CallLogWrapper::glUniform1i(this_00,location,v0);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,5,0x1403,pvVar11);
      pvVar11 = (void *)((long)pvVar11 + 0x14);
      v0 = v0 + 1;
    } while ((int)pvVar11 != 0x50);
    pRVar5 = (this->super_ComputeShaderBase).renderTarget;
    if ((99 < pRVar5->m_width) && (99 < pRVar5->m_height)) {
      pvVar11 = operator_new(120000);
      memset(pvVar11,0,120000);
      glu::CallLogWrapper::glReadPixels(this_00,0,0,100,100,0x1907,0x1406,pvVar11);
      lVar8 = (long)pvVar11 + 0x2f60;
      bVar6 = true;
      uVar16 = 10;
      do {
        uVar12 = 10;
        lVar13 = 0;
        do {
          fVar4 = *(float *)(lVar8 + -8 + lVar13);
          fVar19 = -fVar4;
          if (-fVar4 <= fVar4) {
            fVar19 = fVar4;
          }
          pvVar1 = &(this->super_ComputeShaderBase).g_color_eps;
          if (pvVar1->m_data[0] <= fVar19 && fVar19 != pvVar1->m_data[0]) {
LAB_009201ba:
            anon_unknown_0::Output
                      ("First bad color (%d, %d): %f %f %f\n",SUB84((double)fVar4,0),
                       SUB84((double)*(float *)(lVar8 + -4 + lVar13),0),
                       SUB84((double)*(float *)(lVar8 + lVar13),0),uVar12,uVar16 & 0xffffffff);
            bVar6 = false;
          }
          else {
            fVar19 = *(float *)(lVar8 + -4 + lVar13);
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 1;
            if (*pfVar14 <= fVar18 && fVar18 != *pfVar14) goto LAB_009201ba;
            fVar19 = *(float *)(lVar8 + lVar13);
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 2;
            if (*pfVar14 <= fVar18 && fVar18 != *pfVar14) goto LAB_009201ba;
          }
          lVar13 = lVar13 + 0xc;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (lVar13 != 0x168);
        uVar16 = uVar16 + 1;
        lVar8 = lVar8 + 0x4b0;
      } while (uVar16 != 0x28);
      lVar8 = (long)pvVar11 + 0x31b8;
      uVar16 = 10;
      do {
        uVar12 = 0x3c;
        lVar13 = 0;
        do {
          fVar4 = *(float *)(lVar8 + -8 + lVar13);
          fVar19 = -fVar4;
          if (-fVar4 <= fVar4) {
            fVar19 = fVar4;
          }
          pvVar1 = &(this->super_ComputeShaderBase).g_color_eps;
          if (pvVar1->m_data[0] <= fVar19 && fVar19 != pvVar1->m_data[0]) {
LAB_0092027b:
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",SUB84((double)fVar4,0),
                       SUB84((double)*(float *)(lVar8 + -4 + lVar13),0),
                       SUB84((double)*(float *)(lVar8 + lVar13),0),uVar12,uVar16 & 0xffffffff);
            bVar6 = false;
          }
          else {
            fVar18 = *(float *)(lVar8 + -4 + lVar13) + -1.0;
            fVar19 = -fVar18;
            if (-fVar18 <= fVar18) {
              fVar19 = fVar18;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 1;
            if (*pfVar14 <= fVar19 && fVar19 != *pfVar14) goto LAB_0092027b;
            fVar19 = *(float *)(lVar8 + lVar13);
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 2;
            if (*pfVar14 <= fVar18 && fVar18 != *pfVar14) goto LAB_0092027b;
          }
          lVar13 = lVar13 + 0xc;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (lVar13 != 0x168);
        uVar16 = uVar16 + 1;
        lVar8 = lVar8 + 0x4b0;
      } while (uVar16 != 0x28);
      lVar8 = (long)pvVar11 + 0x11c18;
      uVar16 = 0x3c;
      do {
        uVar12 = 0x3c;
        lVar13 = 0;
        do {
          fVar4 = *(float *)(lVar8 + -8 + lVar13);
          fVar18 = fVar4 + -1.0;
          fVar19 = -fVar18;
          if (-fVar18 <= fVar18) {
            fVar19 = fVar18;
          }
          pvVar1 = &(this->super_ComputeShaderBase).g_color_eps;
          if (pvVar1->m_data[0] <= fVar19 && fVar19 != pvVar1->m_data[0]) {
LAB_00920347:
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",SUB84((double)fVar4,0),
                       SUB84((double)*(float *)(lVar8 + -4 + lVar13),0),
                       SUB84((double)*(float *)(lVar8 + lVar13),0),uVar12,uVar16 & 0xffffffff);
            bVar6 = false;
          }
          else {
            fVar18 = *(float *)(lVar8 + -4 + lVar13) + -1.0;
            fVar19 = -fVar18;
            if (-fVar18 <= fVar18) {
              fVar19 = fVar18;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 1;
            if (*pfVar14 <= fVar19 && fVar19 != *pfVar14) goto LAB_00920347;
            fVar19 = *(float *)(lVar8 + lVar13);
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 2;
            if (*pfVar14 <= fVar18 && fVar18 != *pfVar14) goto LAB_00920347;
          }
          lVar13 = lVar13 + 0xc;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (lVar13 != 0x168);
        uVar16 = uVar16 + 1;
        lVar8 = lVar8 + 0x4b0;
      } while (uVar16 != 0x5a);
      lVar8 = (long)pvVar11 + 0x119c0;
      uVar16 = 0x3c;
      do {
        uVar12 = 10;
        lVar13 = 0;
        do {
          fVar4 = *(float *)(lVar8 + -8 + lVar13);
          fVar19 = -fVar4;
          if (-fVar4 <= fVar4) {
            fVar19 = fVar4;
          }
          pvVar1 = &(this->super_ComputeShaderBase).g_color_eps;
          if (pvVar1->m_data[0] <= fVar19 && fVar19 != pvVar1->m_data[0]) {
LAB_00920408:
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",SUB84((double)fVar4,0),
                       SUB84((double)*(float *)(lVar8 + -4 + lVar13),0),
                       SUB84((double)*(float *)(lVar8 + lVar13),0),uVar12,uVar16 & 0xffffffff);
            bVar6 = false;
          }
          else {
            fVar19 = *(float *)(lVar8 + -4 + lVar13);
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 1;
            if (*pfVar14 <= fVar18 && fVar18 != *pfVar14) goto LAB_00920408;
            fVar18 = *(float *)(lVar8 + lVar13) + -1.0;
            fVar19 = -fVar18;
            if (-fVar18 <= fVar18) {
              fVar19 = fVar18;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 2;
            if (*pfVar14 <= fVar19 && fVar19 != *pfVar14) goto LAB_00920408;
          }
          lVar13 = lVar13 + 0xc;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (lVar13 != 0x168);
        uVar16 = uVar16 + 1;
        lVar8 = lVar8 + 0x4b0;
      } while (uVar16 != 0x5a);
      pfVar14 = (float *)((long)pvVar11 + 0xe108);
      uVar16 = 0x30;
      do {
        uVar12 = 0;
        pfVar15 = pfVar14;
        do {
          fVar4 = pfVar15[-2];
          fVar19 = -fVar4;
          if (-fVar4 <= fVar4) {
            fVar19 = fVar4;
          }
          pvVar1 = &(this->super_ComputeShaderBase).g_color_eps;
          if (pvVar1->m_data[0] <= fVar19 && fVar19 != pvVar1->m_data[0]) {
LAB_009204c4:
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",SUB84((double)fVar4,0),
                       SUB84((double)pfVar15[-1],0),SUB84((double)*pfVar15,0),uVar12 & 0xffffffff,
                       uVar16 & 0xffffffff);
            bVar6 = false;
          }
          else {
            fVar19 = pfVar15[-1];
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar2 = (this->super_ComputeShaderBase).g_color_eps.m_data + 1;
            if (*pfVar2 <= fVar18 && fVar18 != *pfVar2) goto LAB_009204c4;
            fVar19 = *pfVar15;
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar2 = (this->super_ComputeShaderBase).g_color_eps.m_data + 2;
            if (*pfVar2 <= fVar18 && fVar18 != *pfVar2) goto LAB_009204c4;
          }
          uVar12 = uVar12 + 1;
          pfVar15 = pfVar15 + 3;
        } while (uVar12 != 100);
        uVar16 = uVar16 + 1;
        pfVar14 = pfVar14 + 300;
      } while (uVar16 != 0x34);
      lVar8 = (long)pvVar11 + 0x248;
      uVar16 = 0;
      do {
        uVar12 = 0x30;
        lVar13 = 0;
        do {
          fVar4 = *(float *)(lVar8 + -8 + lVar13);
          fVar19 = -fVar4;
          if (-fVar4 <= fVar4) {
            fVar19 = fVar4;
          }
          pvVar1 = &(this->super_ComputeShaderBase).g_color_eps;
          if (pvVar1->m_data[0] <= fVar19 && fVar19 != pvVar1->m_data[0]) {
LAB_00920573:
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",SUB84((double)fVar4,0),
                       SUB84((double)*(float *)(lVar8 + -4 + lVar13),0),
                       SUB84((double)*(float *)(lVar8 + lVar13),0),uVar12,uVar16 & 0xffffffff);
            bVar6 = false;
          }
          else {
            fVar19 = *(float *)(lVar8 + -4 + lVar13);
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 1;
            if (*pfVar14 <= fVar18 && fVar18 != *pfVar14) goto LAB_00920573;
            fVar19 = *(float *)(lVar8 + lVar13);
            fVar18 = -fVar19;
            if (-fVar19 <= fVar19) {
              fVar18 = fVar19;
            }
            pfVar14 = (this->super_ComputeShaderBase).g_color_eps.m_data + 2;
            if (*pfVar14 <= fVar18 && fVar18 != *pfVar14) goto LAB_00920573;
          }
          lVar13 = lVar13 + 0xc;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (lVar13 != 0x30);
        uVar16 = uVar16 + 1;
        lVar8 = lVar8 + 0x4b0;
      } while (uVar16 != 100);
      operator_delete(pvVar11,120000);
      if (!bVar6) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &res);
		if (res <= 0)
		{
			OutputNotSupported("GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0");
			return NO_ERROR;
		}

		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "struct DrawCommand {" NL "  uint count;" NL
			   "  uint instance_count;" NL "  uint first_index;" NL "  int base_vertex;" NL "  uint base_instance;" NL
			   "};" NL "layout(std430) buffer;" NL "layout(binding = 0) readonly buffer ObjectBuffer {" NL
			   "  mat4 transform[4];" NL "  uint count[4];" NL "  uint first_index[4];" NL "} g_objects;" NL
			   "layout(binding = 1) writeonly buffer DrawCommandBuffer {" NL "  DrawCommand g_command[4];" NL "};" NL
			   "bool IsObjectVisible(uint id) {" NL
			   "  if (g_objects.transform[id][3].x < -1.0 || g_objects.transform[id][3].x > 1.0) return false;" NL
			   "  if (g_objects.transform[id][3][1] < -1.0 || g_objects.transform[id][3][1] > 1.0) return false;" NL
			   "  if (g_objects.transform[id][3][2] < -1.0 || g_objects.transform[id][3].z > 1.0) return false;" NL
			   "  return true;" NL "}" NL "void main() {" NL "  uint id = gl_GlobalInvocationID.x;" NL
			   "  g_command[id].count = 0;" NL "  g_command[id].instance_count = 0;" NL
			   "  g_command[id].first_index = 0;" NL "  g_command[id].base_vertex = 0;" NL
			   "  g_command[id].base_instance = 0;" NL "  if (IsObjectVisible(id)) {" NL
			   "    g_command[id].count = g_objects.count[id];" NL "    g_command[id].instance_count = 1;" NL
			   "    g_command[id].first_index = g_objects.first_index[id];" NL "  }" NL "}";
		m_program[0] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in vec3 g_color;" NL
			   "out StageData {" NL "  vec3 color;" NL "} g_vs_out;" NL
			   "layout(binding = 0, std430) buffer ObjectBuffer {" NL "  mat4 transform[4];" NL "  uint count[4];" NL
			   "  uint first_index[4];" NL "} g_objects;" NL "uniform int g_object_id;" NL "void main() {" NL
			   "  gl_Position = g_objects.transform[g_object_id] * g_position;" NL "  g_vs_out.color = g_color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec3 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_color;" NL
			   "void main() {" NL "  g_color = vec4(g_fs_in.color, 1);" NL "}";
		m_program[1] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;
		glViewport(0, 0, 100, 100);

		/* object buffer */
		{
			struct
			{
				mat4   transform[4];
				GLuint count[4];
				GLuint first_index[4];
			} data = {
				{ tcu::translationMatrix(vec3(-1.5f, -0.5f, 0.0f)), tcu::translationMatrix(vec3(0.5f, -0.5f, 0.0f)),
				  tcu::translationMatrix(vec3(-0.5f, 0.5f, 0.0f)), tcu::translationMatrix(vec3(0.5f, 0.5f, 0.0f)) },
				{ 4, 4, 4, 4 },
				{ 0, 4, 8, 12 }
			};
			glGenBuffers(1, &m_object_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_object_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		/* vertex buffer */
		{
			const vec3 data[] = { vec3(-0.4f, -0.4f, 0.0f), vec3(1, 0, 0), vec3(0.4f, -0.4f, 0.0f), vec3(1, 0, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(1, 0, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(1, 0, 0),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(0, 1, 0), vec3(0.4f, -0.4f, 0.0f), vec3(0, 1, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(0, 1, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(0, 1, 0),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(0, 0, 1), vec3(0.4f, -0.4f, 0.0f), vec3(0, 0, 1),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(0, 0, 1), vec3(0.4f, 0.4f, 0.0f),  vec3(0, 0, 1),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(1, 1, 0), vec3(0.4f, -0.4f, 0.0f), vec3(1, 1, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(1, 1, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(1, 1, 0) };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		/* index buffer */
		{
			const GLushort data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };
			glGenBuffers(1, &m_index_buffer);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		glGenBuffers(1, &m_draw_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_buffer);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4 * sizeof(GLuint) * 5, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 2 * sizeof(vec3), 0);
		glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 2 * sizeof(vec3), reinterpret_cast<void*>(sizeof(vec3)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
		glBindVertexArray(0);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_draw_buffer);
		glUseProgram(m_program[0]);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_buffer);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT);
		/* draw (CPU draw calls dispatch, could be done by the GPU with ARB_multi_draw_indirect) */
		{
			GLsizeiptr offset = 0;
			for (int i = 0; i < 4; ++i)
			{
				glUniform1i(glGetUniformLocation(m_program[1], "g_object_id"), i);
				glDrawElementsIndirect(GL_TRIANGLE_STRIP, GL_UNSIGNED_SHORT, reinterpret_cast<void*>(offset));
				offset += 5 * sizeof(GLuint);
			}
		}
		if (getWindowWidth() >= 100 && getWindowHeight() >= 100 &&
			!ValidateWindow4Quads(vec3(0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}